

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O0

int abuf_vappendf(autobuf *autobuf,char *format,__va_list_tag *ap)

{
  undefined1 auStack_48 [8];
  va_list ap2;
  int result;
  __va_list_tag *ap_local;
  char *format_local;
  autobuf *autobuf_local;
  
  if (autobuf == (autobuf *)0x0) {
    autobuf_local._4_4_ = 0;
  }
  else {
    ap2[0].overflow_arg_area = ap->reg_save_area;
    auStack_48._0_4_ = ap->gp_offset;
    auStack_48._4_4_ = ap->fp_offset;
    ap2[0]._0_8_ = ap->overflow_arg_area;
    autobuf_local._4_4_ = _vappendf(autobuf,format,ap,(__va_list_tag *)auStack_48);
  }
  return autobuf_local._4_4_;
}

Assistant:

int
abuf_vappendf(struct autobuf *autobuf, const char *format, va_list ap) {
  int result;
  va_list ap2;

  if (!autobuf) {
    return 0;
  }

  va_copy(ap2, ap);
  result = _vappendf(autobuf, format, ap, ap2);
  va_end(ap2);

  return result;
}